

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O2

size_t jessilib::starts_with_length<char16_t,char16_t>
                 (basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string,
                 basic_string_view<char16_t,_std::char_traits<char16_t>_> in_prefix)

{
  char16_t *pcVar2;
  jessilib *this;
  jessilib *this_00;
  size_t sVar3;
  decode_result dVar4;
  decode_result dVar5;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string_00;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string_01;
  size_t local_40;
  char16_t *local_38;
  jessilib *pjVar1;
  
  pcVar2 = in_string._M_str;
  this = (jessilib *)in_string._M_len;
  local_38 = in_prefix._M_str;
  pjVar1 = (jessilib *)in_prefix._M_len;
  if (this < pjVar1) {
    local_40 = 0;
  }
  else {
    sVar3 = 0;
    for (this_00 = pjVar1; (this != (jessilib *)0x0 && (this_00 != (jessilib *)0x0));
        this_00 = this_00 + -(long)pjVar1) {
      in_string_00._M_str = (char16_t *)pjVar1;
      in_string_00._M_len = (size_t)pcVar2;
      dVar4 = decode_codepoint_utf16<char16_t>(this,in_string_00);
      in_string_01._M_str = (char16_t *)dVar4.units;
      in_string_01._M_len = (size_t)local_38;
      dVar5 = decode_codepoint_utf16<char16_t>(this_00,in_string_01);
      pjVar1 = (jessilib *)dVar5.units;
      if (in_string_01._M_str == (char16_t *)0x0) {
        return 0;
      }
      if (pjVar1 == (jessilib *)0x0) {
        return 0;
      }
      if (dVar4.codepoint != dVar5.codepoint) {
        return 0;
      }
      pcVar2 = pcVar2 + (long)in_string_01._M_str;
      this = this + -(long)in_string_01._M_str;
      local_38 = local_38 + (long)pjVar1;
      sVar3 = sVar3 + (long)in_string_01._M_str;
    }
    local_40 = 0;
    if (this_00 == (jessilib *)0x0) {
      local_40 = sVar3;
    }
  }
  return local_40;
}

Assistant:

size_t starts_with_length(std::basic_string_view<LhsCharT> in_string, std::basic_string_view<RhsCharT> in_prefix) {
	// If in_string and in_prefix are the same type, compare their sizes and quickly return if in_string is too small
	if constexpr (std::is_same_v<LhsCharT, RhsCharT>) {
		if (in_string.size() < in_prefix.size()) {
			return 0;
		}
	}

	size_t codepoints_removed{};
	while (!in_string.empty() && !in_prefix.empty()) {
		decode_result string_front = decode_codepoint(in_string);
		decode_result prefix_front = decode_codepoint(in_prefix);

		if (string_front.units == 0
			|| prefix_front.units == 0) {
			// Failed to decode front codepoint; bad unicode sequence
			return 0;
		}

		if (string_front.codepoint != prefix_front.codepoint) {
			// Codepoints aren't the same
			return 0;
		}

		// Codepoints are equal; trim off the fronts and continue
		in_string.remove_prefix(string_front.units);
		in_prefix.remove_prefix(prefix_front.units);
		codepoints_removed += string_front.units;
	}

	if (!in_prefix.empty()) {
		// We reached end of in_string before end of prefix
		return 0;
	}

	return codepoints_removed;
}